

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenGlobalInitializer.cxx
# Opt level: O1

bool __thiscall
cmQtAutoGenGlobalInitializer::InitializeCustomTargets(cmQtAutoGenGlobalInitializer *this)

{
  pointer puVar1;
  bool bVar2;
  cmQtAutoGenGlobalInitializer *pcVar3;
  cmQtAutoGenGlobalInitializer *pcVar4;
  cmQtAutoGenGlobalInitializer *pcVar5;
  cmQtAutoGenGlobalInitializer *this_00;
  pointer puVar6;
  bool bVar7;
  string comment;
  undefined1 local_48 [32];
  
  pcVar4 = (cmQtAutoGenGlobalInitializer *)local_48;
  this_00 = (cmQtAutoGenGlobalInitializer *)local_48;
  puVar6 = (pointer)(local_48 + 0x10);
  local_48._0_8_ = puVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"Global AUTOGEN target","");
  pcVar3 = (cmQtAutoGenGlobalInitializer *)
           (this->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (pcVar5 = pcVar3,
        pcVar5 != (cmQtAutoGenGlobalInitializer *)
                  &(this->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header) {
    GetOrCreateGlobalTarget
              (pcVar4,*(cmLocalGenerator **)
                       &(pcVar5->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header._M_header
               ,(string *)
                &(pcVar5->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header._M_header.
                 _M_parent,(string *)local_48);
    pcVar3 = (cmQtAutoGenGlobalInitializer *)std::_Rb_tree_increment((_Rb_tree_node_base *)pcVar5);
    pcVar4 = pcVar5;
  }
  if ((pointer)local_48._0_8_ != puVar6) {
    operator_delete((void *)local_48._0_8_,
                    (ulong)((long)&(((pointer)local_48._16_8_)->_M_t).
                                   super___uniq_ptr_impl<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_cmQtAutoGenInitializer_*,_std::default_delete<cmQtAutoGenInitializer>_>
                                   .super__Head_base<0UL,_cmQtAutoGenInitializer_*,_false>.
                                   _M_head_impl + 1));
  }
  local_48._0_8_ = puVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"Global AUTORCC target","");
  pcVar4 = (cmQtAutoGenGlobalInitializer *)
           (this->GlobalAutoRccTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (pcVar3 = pcVar4,
        pcVar3 != (cmQtAutoGenGlobalInitializer *)
                  &(this->GlobalAutoRccTargets_)._M_t._M_impl.super__Rb_tree_header) {
    GetOrCreateGlobalTarget
              (this_00,*(cmLocalGenerator **)
                        &(pcVar3->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header.
                         _M_header,
               (string *)
               &(pcVar3->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_parent,(string *)local_48);
    pcVar4 = (cmQtAutoGenGlobalInitializer *)std::_Rb_tree_increment((_Rb_tree_node_base *)pcVar3);
    this_00 = pcVar3;
  }
  if ((pointer)local_48._0_8_ != puVar6) {
    operator_delete((void *)local_48._0_8_,
                    (ulong)((long)&(((pointer)local_48._16_8_)->_M_t).
                                   super___uniq_ptr_impl<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_cmQtAutoGenInitializer_*,_std::default_delete<cmQtAutoGenInitializer>_>
                                   .super__Head_base<0UL,_cmQtAutoGenInitializer_*,_false>.
                                   _M_head_impl + 1));
  }
  puVar6 = (this->Initializers_).
           super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->Initializers_).
           super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar7 = puVar6 == puVar1;
  if ((!bVar7) &&
     (bVar2 = cmQtAutoGenInitializer::InitCustomTargets
                        ((puVar6->_M_t).
                         super___uniq_ptr_impl<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmQtAutoGenInitializer_*,_std::default_delete<cmQtAutoGenInitializer>_>
                         .super__Head_base<0UL,_cmQtAutoGenInitializer_*,_false>._M_head_impl),
     bVar2)) {
    do {
      puVar6 = puVar6 + 1;
      bVar7 = puVar6 == puVar1;
      if (bVar7) {
        return bVar7;
      }
      bVar2 = cmQtAutoGenInitializer::InitCustomTargets
                        ((puVar6->_M_t).
                         super___uniq_ptr_impl<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmQtAutoGenInitializer_*,_std::default_delete<cmQtAutoGenInitializer>_>
                         .super__Head_base<0UL,_cmQtAutoGenInitializer_*,_false>._M_head_impl);
    } while (bVar2);
  }
  return bVar7;
}

Assistant:

bool cmQtAutoGenGlobalInitializer::InitializeCustomTargets()
{
  // Initialize global autogen targets
  {
    std::string const comment = "Global AUTOGEN target";
    for (auto const& pair : GlobalAutoGenTargets_) {
      GetOrCreateGlobalTarget(pair.first, pair.second, comment);
    }
  }
  // Initialize global autorcc targets
  {
    std::string const comment = "Global AUTORCC target";
    for (auto const& pair : GlobalAutoRccTargets_) {
      GetOrCreateGlobalTarget(pair.first, pair.second, comment);
    }
  }
  // Initialize per target autogen targets
  for (auto& initializer : Initializers_) {
    if (!initializer->InitCustomTargets()) {
      return false;
    }
  }
  return true;
}